

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

int uv_poll_init(uv_loop_t *loop,uv_poll_t *handle,int fd)

{
  uv__queue *puVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = uv__fd_exists(loop,fd);
  iVar3 = -0x11;
  if (iVar2 == 0) {
    iVar3 = uv__io_check_fd(loop,fd);
    if (iVar3 == 0) {
      iVar3 = uv__nonblock_ioctl(fd,1);
      if (iVar3 == -0x19) {
        iVar3 = uv__nonblock_fcntl(fd,1);
      }
      if (iVar3 == 0) {
        handle->loop = loop;
        handle->type = UV_POLL;
        handle->flags = 8;
        (handle->handle_queue).next = &loop->handle_queue;
        puVar1 = (loop->handle_queue).prev;
        (handle->handle_queue).prev = puVar1;
        puVar1->next = &handle->handle_queue;
        (loop->handle_queue).prev = &handle->handle_queue;
        iVar3 = 0;
        handle->next_closing = (uv_handle_t *)0x0;
        uv__io_init(&handle->io_watcher,uv__poll_io,fd);
        handle->poll_cb = (uv_poll_cb)0x0;
      }
    }
  }
  return iVar3;
}

Assistant:

int uv_poll_init(uv_loop_t* loop, uv_poll_t* handle, int fd) {
  int err;

  if (uv__fd_exists(loop, fd))
    return UV_EEXIST;

  err = uv__io_check_fd(loop, fd);
  if (err)
    return err;

  /* If ioctl(FIONBIO) reports ENOTTY, try fcntl(F_GETFL) + fcntl(F_SETFL).
   * Workaround for e.g. kqueue fds not supporting ioctls.
   */
  err = uv__nonblock(fd, 1);
#if UV__NONBLOCK_IS_IOCTL
  if (err == UV_ENOTTY)
    err = uv__nonblock_fcntl(fd, 1);
#endif

  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*) handle, UV_POLL);
  uv__io_init(&handle->io_watcher, uv__poll_io, fd);
  handle->poll_cb = NULL;
  return 0;
}